

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

double png_pow10(int power)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double mult;
  double dVar4;
  
  uVar2 = power;
  if (power < 0) {
    if (power < -0x133) {
      return 0.0;
    }
    uVar2 = -power;
  }
  if (0 < (int)uVar2) {
    dVar4 = 10.0;
    dVar3 = 1.0;
    do {
      if ((uVar2 & 1) != 0) {
        dVar3 = dVar3 * dVar4;
      }
      dVar4 = dVar4 * dVar4;
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 >> 1;
    } while (bVar1);
    if (power < 0) {
      dVar3 = 1.0 / dVar3;
    }
    return dVar3;
  }
  return 1.0;
}

Assistant:

static double
png_pow10(int power)
{
   int recip = 0;
   double d = 1;

   /* Handle negative exponent with a reciprocal at the end because
    * 10 is exact whereas .1 is inexact in base 2
    */
   if (power < 0)
   {
      if (power < DBL_MIN_10_EXP) return 0;
      recip = 1; power = -power;
   }

   if (power > 0)
   {
      /* Decompose power bitwise. */
      double mult = 10;
      do
      {
         if (power & 1) d *= mult;
         mult *= mult;
         power >>= 1;
      }
      while (power > 0);

      if (recip != 0) d = 1/d;
   }
   /* else power is 0 and d is 1 */

   return d;
}